

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

KeyInfo * keyInfoFromExprList(Parse *pParse,ExprList *pList,int iStart,int nExtra)

{
  int iVar1;
  sqlite3 *db;
  KeyInfo *pKVar2;
  CollSeq *pCVar3;
  long lVar4;
  ExprList_item *pEVar5;
  int N;
  
  db = pParse->db;
  iVar1 = pList->nExpr;
  N = iVar1 - iStart;
  pKVar2 = sqlite3KeyInfoAlloc(db,N,nExtra + 1);
  if (pKVar2 != (KeyInfo *)0x0 && (N != 0 && iStart <= iVar1)) {
    pEVar5 = pList->a + (uint)iStart;
    lVar4 = 0;
    do {
      pCVar3 = sqlite3ExprCollSeq(pParse,pEVar5->pExpr);
      if (pCVar3 == (CollSeq *)0x0) {
        pCVar3 = db->pDfltColl;
      }
      pKVar2->aColl[lVar4] = pCVar3;
      pKVar2->aSortOrder[lVar4] = pEVar5->sortOrder;
      pEVar5 = pEVar5 + 1;
      lVar4 = lVar4 + 1;
    } while (N != (int)lVar4);
  }
  return pKVar2;
}

Assistant:

static KeyInfo *keyInfoFromExprList(
  Parse *pParse,       /* Parsing context */
  ExprList *pList,     /* Form the KeyInfo object from this ExprList */
  int iStart,          /* Begin with this column of pList */
  int nExtra           /* Add this many extra columns to the end */
){
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3KeyInfoAlloc(db, nExpr-iStart, nExtra+1);
  if( pInfo ){
    assert( sqlite3KeyInfoIsWriteable(pInfo) );
    for(i=iStart, pItem=pList->a+iStart; i<nExpr; i++, pItem++){
      CollSeq *pColl;
      pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      if( !pColl ) pColl = db->pDfltColl;
      pInfo->aColl[i-iStart] = pColl;
      pInfo->aSortOrder[i-iStart] = pItem->sortOrder;
    }
  }
  return pInfo;
}